

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *old)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  QArrayData *data;
  bool bVar3;
  QResourceRoot **__dest;
  long lVar4;
  Int IVar5;
  long lVar6;
  qsizetype toCopy;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar7;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((n < 1) || (bVar3)) goto LAB_00255d3c;
    if (pQVar2 == (QArrayData *)0x0) {
      lVar4 = 1;
      lVar6 = 0;
    }
    else {
      lVar4 = pQVar2->alloc + 1;
      lVar6 = (this->size - pQVar2->alloc) +
              ((long)((long)this->ptr - ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0))
              >> 3);
    }
    pVar7 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,8,lVar4 + lVar6,Grow);
    if (pVar7.second == (void *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
      goto LAB_00255fe3;
    }
    this->d = (Data *)pVar7.first;
    this->ptr = (QResourceRoot **)pVar7.second;
  }
  else {
LAB_00255d3c:
    pDVar1 = this->d;
    if (pDVar1 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar1->super_QArrayData).alloc;
    }
    lVar6 = this->size;
    if (lVar4 < lVar6) {
      lVar4 = lVar6;
    }
    if (where == GrowsAtEnd) {
      if (pDVar1 == (Data *)0x0) goto LAB_00255db5;
      lVar6 = (pDVar1->super_QArrayData).alloc -
              (lVar6 + ((long)((long)this->ptr -
                              ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) &
                              0xfffffffffffffff0)) >> 3));
    }
    else if (pDVar1 == (Data *)0x0) {
LAB_00255db5:
      lVar6 = 0;
    }
    else {
      lVar6 = (long)((long)this->ptr -
                    ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
              3;
    }
    lVar6 = (lVar4 + n) - lVar6;
    if (pDVar1 != (Data *)0x0) {
      lVar4 = (pDVar1->super_QArrayData).alloc;
      if (lVar4 <= lVar6) {
        lVar4 = lVar6;
      }
      if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar6 = lVar4;
      }
    }
    if (pDVar1 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar1->super_QArrayData).alloc;
    }
    local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    __dest = (QResourceRoot **)QArrayData::allocate(&local_38,8,0x10,lVar6,(uint)(lVar6 <= lVar4));
    pQVar2 = local_38;
    if (__dest != (QResourceRoot **)0x0 && local_38 != (QArrayData *)0x0) {
      if (where == GrowsAtBeginning) {
        lVar6 = (local_38->alloc - (this->size + n)) / 2;
        lVar4 = 0;
        if (0 < lVar6) {
          lVar4 = lVar6;
        }
        lVar4 = lVar4 + n;
      }
      else if (this->d == (Data *)0x0) {
        lVar4 = 0;
      }
      else {
        lVar4 = (long)((long)this->ptr -
                      ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3;
      }
      if (this->d == (Data *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = (this->d->super_QArrayData).flags.
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                super_QFlagsStorage<QArrayData::ArrayOption>.i;
      }
      __dest = __dest + lVar4;
      (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar5;
    }
    if ((0 < n) && (__dest == (QResourceRoot **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
      goto LAB_00255fe3;
    }
    lVar4 = this->size;
    if (lVar4 == 0) {
      lVar4 = 0;
    }
    else {
      memcpy(__dest,this->ptr,lVar4 * 8);
    }
    data = &this->d->super_QArrayData;
    this->d = (Data *)pQVar2;
    this->ptr = __dest;
    this->size = lVar4;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_00255fe3:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }